

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

char * __thiscall
Assimp::FBX::FBXConverter::NameTransformationCompProperty
          (FBXConverter *this,TransformationComp comp)

{
  if (comp < TransformationComp_MAXIMUM) {
    return &DAT_0070c70c + *(int *)(&DAT_0070c70c + (ulong)comp * 4);
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x234,
                "const char *Assimp::FBX::FBXConverter::NameTransformationCompProperty(TransformationComp)"
               );
}

Assistant:

const char* FBXConverter::NameTransformationCompProperty(TransformationComp comp) {
            switch (comp) {
            case TransformationComp_Translation:
                return "Lcl Translation";
            case TransformationComp_RotationOffset:
                return "RotationOffset";
            case TransformationComp_RotationPivot:
                return "RotationPivot";
            case TransformationComp_PreRotation:
                return "PreRotation";
            case TransformationComp_Rotation:
                return "Lcl Rotation";
            case TransformationComp_PostRotation:
                return "PostRotation";
            case TransformationComp_RotationPivotInverse:
                return "RotationPivotInverse";
            case TransformationComp_ScalingOffset:
                return "ScalingOffset";
            case TransformationComp_ScalingPivot:
                return "ScalingPivot";
            case TransformationComp_Scaling:
                return "Lcl Scaling";
            case TransformationComp_ScalingPivotInverse:
                return "ScalingPivotInverse";
            case TransformationComp_GeometricScaling:
                return "GeometricScaling";
            case TransformationComp_GeometricRotation:
                return "GeometricRotation";
            case TransformationComp_GeometricTranslation:
                return "GeometricTranslation";
            case TransformationComp_GeometricScalingInverse:
                return "GeometricScalingInverse";
            case TransformationComp_GeometricRotationInverse:
                return "GeometricRotationInverse";
            case TransformationComp_GeometricTranslationInverse:
                return "GeometricTranslationInverse";
            case TransformationComp_MAXIMUM: // this is to silence compiler warnings
                break;
            }

            ai_assert(false);

            return nullptr;
        }